

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::InitialPass
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_a8 [8];
  string e;
  undefined1 local_80 [8];
  string subCommand;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"must be called with at least two arguments.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005775ce;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::string((string *)local_80,(string *)pvVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,"WRITE");
  if (bVar1) {
    this_local._7_1_ =
         HandleWriteCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_2_local,false);
    e.field_2._12_4_ = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"APPEND");
    if (bVar1) {
      this_local._7_1_ =
           HandleWriteCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,true);
      e.field_2._12_4_ = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"DOWNLOAD");
      if (bVar1) {
        this_local._7_1_ =
             HandleDownloadCommand
                       (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local);
        e.field_2._12_4_ = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"UPLOAD");
        if (bVar1) {
          this_local._7_1_ =
               HandleUploadCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local);
          e.field_2._12_4_ = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"READ");
          if (bVar1) {
            this_local._7_1_ =
                 HandleReadCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local);
            e.field_2._12_4_ = 1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80,"MD5");
            if (!bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_80,"SHA1");
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_80,"SHA224");
                if (!bVar1) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_80,"SHA256");
                  if (!bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_80,"SHA384");
                    if (!bVar1) {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_80,"SHA512");
                      if (!bVar1) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_80,"STRINGS");
                        if (bVar1) {
                          this_local._7_1_ =
                               HandleStringsCommand
                                         (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)param_2_local);
                          e.field_2._12_4_ = 1;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"GLOB");
                          if (bVar1) {
                            this_local._7_1_ =
                                 HandleGlobCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                            e.field_2._12_4_ = 1;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"GLOB_RECURSE");
                            if (bVar1) {
                              this_local._7_1_ =
                                   HandleGlobCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                              e.field_2._12_4_ = 1;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"MAKE_DIRECTORY");
                              if (bVar1) {
                                this_local._7_1_ =
                                     HandleMakeDirectoryCommand
                                               (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                e.field_2._12_4_ = 1;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"RENAME");
                                if (bVar1) {
                                  this_local._7_1_ =
                                       HandleRename(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                  e.field_2._12_4_ = 1;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"REMOVE");
                                  if (bVar1) {
                                    this_local._7_1_ =
                                         HandleRemove(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                    e.field_2._12_4_ = 1;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"REMOVE_RECURSE");
                                    if (bVar1) {
                                      this_local._7_1_ =
                                           HandleRemove(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                      e.field_2._12_4_ = 1;
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"COPY");
                                      if (bVar1) {
                                        this_local._7_1_ =
                                             HandleCopyCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                        e.field_2._12_4_ = 1;
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"INSTALL");
                                        if (bVar1) {
                                          this_local._7_1_ =
                                               HandleInstallCommand
                                                         (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                          e.field_2._12_4_ = 1;
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"DIFFERENT");
                                          if (bVar1) {
                                            this_local._7_1_ =
                                                 HandleDifferentCommand
                                                           (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                            e.field_2._12_4_ = 1;
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"RPATH_CHANGE");
                                            if (!bVar1) {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"CHRPATH");
                                              if (!bVar1) {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"RPATH_CHECK");
                                                if (bVar1) {
                                                  this_local._7_1_ =
                                                       HandleRPathCheckCommand
                                                                 (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                }
                                                else {
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"RPATH_REMOVE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleRPathRemoveCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"RELATIVE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleRelativePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"TO_CMAKE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleCMakePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"TO_NATIVE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleCMakePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"TIMESTAMP");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleTimestampCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"GENERATE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleGenerateCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80,"LOCK");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleLockCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  e.field_2._12_4_ = 1;
                                                  }
                                                  else {
                                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a8,"does not recognize sub-command ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_80);
                                                  cmCommand::SetError(&this->super_cmCommand,
                                                                      (string *)local_a8);
                                                  this_local._7_1_ = 0;
                                                  e.field_2._12_4_ = 1;
                                                  std::__cxx11::string::~string((string *)local_a8);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                goto LAB_005775b8;
                                              }
                                            }
                                            this_local._7_1_ =
                                                 HandleRPathChangeCommand
                                                           (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                            e.field_2._12_4_ = 1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        goto LAB_005775b8;
                      }
                    }
                  }
                }
              }
            }
            this_local._7_1_ =
                 HandleHashCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local);
            e.field_2._12_4_ = 1;
          }
        }
      }
    }
  }
LAB_005775b8:
  std::__cxx11::string::~string((string *)local_80);
LAB_005775ce:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("must be called with at least two arguments.");
    return false;
    }
  std::string subCommand = args[0];
  if ( subCommand == "WRITE" )
    {
    return this->HandleWriteCommand(args, false);
    }
  else if ( subCommand == "APPEND" )
    {
    return this->HandleWriteCommand(args, true);
    }
  else if ( subCommand == "DOWNLOAD" )
    {
    return this->HandleDownloadCommand(args);
    }
  else if ( subCommand == "UPLOAD" )
    {
    return this->HandleUploadCommand(args);
    }
  else if ( subCommand == "READ" )
    {
    return this->HandleReadCommand(args);
    }
  else if ( subCommand == "MD5" ||
            subCommand == "SHA1" ||
            subCommand == "SHA224" ||
            subCommand == "SHA256" ||
            subCommand == "SHA384" ||
            subCommand == "SHA512" )
    {
    return this->HandleHashCommand(args);
    }
  else if ( subCommand == "STRINGS" )
    {
    return this->HandleStringsCommand(args);
    }
  else if ( subCommand == "GLOB" )
    {
    return this->HandleGlobCommand(args, false);
    }
  else if ( subCommand == "GLOB_RECURSE" )
    {
    return this->HandleGlobCommand(args, true);
    }
  else if ( subCommand == "MAKE_DIRECTORY" )
    {
    return this->HandleMakeDirectoryCommand(args);
    }
  else if ( subCommand == "RENAME" )
    {
    return this->HandleRename(args);
    }
  else if ( subCommand == "REMOVE" )
    {
    return this->HandleRemove(args, false);
    }
  else if ( subCommand == "REMOVE_RECURSE" )
    {
    return this->HandleRemove(args, true);
    }
  else if ( subCommand == "COPY" )
    {
    return this->HandleCopyCommand(args);
    }
  else if ( subCommand == "INSTALL" )
    {
    return this->HandleInstallCommand(args);
    }
  else if ( subCommand == "DIFFERENT" )
    {
    return this->HandleDifferentCommand(args);
    }
  else if ( subCommand == "RPATH_CHANGE" || subCommand == "CHRPATH" )
    {
    return this->HandleRPathChangeCommand(args);
    }
  else if ( subCommand == "RPATH_CHECK" )
    {
    return this->HandleRPathCheckCommand(args);
    }
  else if ( subCommand == "RPATH_REMOVE" )
    {
    return this->HandleRPathRemoveCommand(args);
    }
  else if ( subCommand == "RELATIVE_PATH" )
    {
    return this->HandleRelativePathCommand(args);
    }
  else if ( subCommand == "TO_CMAKE_PATH" )
    {
    return this->HandleCMakePathCommand(args, false);
    }
  else if ( subCommand == "TO_NATIVE_PATH" )
    {
    return this->HandleCMakePathCommand(args, true);
    }
  else if ( subCommand == "TIMESTAMP" )
    {
    return this->HandleTimestampCommand(args);
    }
  else if ( subCommand == "GENERATE" )
    {
    return this->HandleGenerateCommand(args);
    }
  else if ( subCommand == "LOCK" )
    {
    return this->HandleLockCommand(args);
    }

  std::string e = "does not recognize sub-command "+subCommand;
  this->SetError(e);
  return false;
}